

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cRGBA,cBGRA,bCopyAlpha>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  EBlend EVar4;
  FSpecialColormap *pFVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_004ece7f_caseD_0:
    if (0 < count) {
      pbVar10 = pin + 3;
      lVar6 = 0;
      do {
        bVar1 = *pbVar10;
        if (bVar1 != 0) {
          uVar8 = (uint)bVar1;
          uVar13 = uVar8 ^ 0xff;
          pout[lVar6 * 4 + 2] =
               (BYTE)((ulong)(pout[lVar6 * 4 + 2] * uVar13 + pbVar10[-3] * uVar8) * 0x1010102 >>
                     0x20);
          pout[lVar6 * 4 + 1] =
               (BYTE)((ulong)(pout[lVar6 * 4 + 1] * uVar13 + pbVar10[-2] * uVar8) * 0x1010102 >>
                     0x20);
          pout[lVar6 * 4] =
               (BYTE)((ulong)(pout[lVar6 * 4] * uVar13 + pbVar10[-1] * uVar8) * 0x1010102 >> 0x20);
          pout[lVar6 * 4 + 3] = bVar1;
        }
        lVar6 = lVar6 + 1;
        pbVar10 = pbVar10 + step;
      } while (count != (int)lVar6);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_004ece7f_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pbVar10 = pin + 3;
        lVar6 = 0;
        do {
          bVar1 = *pbVar10;
          if (bVar1 != 0) {
            uVar13 = (uint)pbVar10[-2] * 0x8f + (uint)pbVar10[-3] * 0x4d +
                     ((uint)pbVar10[-1] + (uint)pbVar10[-1] * 8) * 4 >> 0xc;
            uVar8 = (uint)bVar1;
            uVar14 = uVar8 ^ 0xff;
            pout[lVar6 * 4 + 2] =
                 (BYTE)((ulong)(pout[lVar6 * 4 + 2] * uVar14 + IcePalette[uVar13][0] * uVar8) *
                        0x1010102 >> 0x20);
            pout[lVar6 * 4 + 1] =
                 (BYTE)((ulong)(pout[lVar6 * 4 + 1] * uVar14 + IcePalette[uVar13][1] * uVar8) *
                        0x1010102 >> 0x20);
            pout[lVar6 * 4] =
                 (BYTE)((ulong)(pout[lVar6 * 4] * uVar14 + IcePalette[uVar13][2] * uVar8) *
                        0x1010102 >> 0x20);
            pout[lVar6 * 4 + 3] = bVar1;
          }
          lVar6 = lVar6 + 1;
          pbVar10 = pbVar10 + step;
        } while (count != (int)lVar6);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pbVar10 = pin + 3;
        lVar6 = 0;
        do {
          bVar1 = *pbVar10;
          if (bVar1 != 0) {
            iVar11 = inf->blendcolor[3];
            bVar2 = pbVar10[-2];
            iVar7 = inf->blendcolor[1];
            bVar3 = pbVar10[-1];
            iVar9 = inf->blendcolor[2];
            uVar13 = (uint)bVar1;
            uVar8 = uVar13 ^ 0xff;
            pout[lVar6 * 4 + 2] =
                 (BYTE)((ulong)(pout[lVar6 * 4 + 2] * uVar8 +
                               ((uint)pbVar10[-3] * iVar11 + inf->blendcolor[0] >> 0x10 & 0xff) *
                               uVar13) * 0x1010102 >> 0x20);
            pout[lVar6 * 4 + 1] =
                 (BYTE)((ulong)(pout[lVar6 * 4 + 1] * uVar8 +
                               ((uint)bVar2 * iVar11 + iVar7 >> 0x10 & 0xff) * uVar13) * 0x1010102
                       >> 0x20);
            pout[lVar6 * 4] =
                 (BYTE)((ulong)(pout[lVar6 * 4] * uVar8 +
                               ((uint)bVar3 * iVar11 + iVar9 >> 0x10 & 0xff) * uVar13) * 0x1010102
                       >> 0x20);
            pout[lVar6 * 4 + 3] = bVar1;
          }
          lVar6 = lVar6 + 1;
          pbVar10 = pbVar10 + step;
        } while (count != (int)lVar6);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pbVar10 = pin + 3;
        lVar6 = 0;
        do {
          bVar1 = *pbVar10;
          if (bVar1 != 0) {
            bVar2 = pbVar10[-2];
            iVar11 = inf->blendcolor[1];
            bVar3 = pbVar10[-1];
            iVar7 = inf->blendcolor[2];
            uVar13 = (uint)bVar1;
            uVar8 = uVar13 ^ 0xff;
            pout[lVar6 * 4 + 2] =
                 (BYTE)((ulong)(pout[lVar6 * 4 + 2] * uVar8 +
                               ((uint)pbVar10[-3] * inf->blendcolor[0] >> 0x10 & 0xff) * uVar13) *
                        0x1010102 >> 0x20);
            pout[lVar6 * 4 + 1] =
                 (BYTE)((ulong)(pout[lVar6 * 4 + 1] * uVar8 +
                               ((uint)bVar2 * iVar11 >> 0x10 & 0xff) * uVar13) * 0x1010102 >> 0x20);
            pout[lVar6 * 4] =
                 (BYTE)((ulong)(pout[lVar6 * 4] * uVar8 +
                               ((uint)bVar3 * iVar7 >> 0x10 & 0xff) * uVar13) * 0x1010102 >> 0x20);
            pout[lVar6 * 4 + 3] = bVar1;
          }
          lVar6 = lVar6 + 1;
          pbVar10 = pbVar10 + step;
        } while (count != (int)lVar6);
      }
      break;
    default:
      EVar4 = inf->blend;
      lVar6 = (long)EVar4;
      if (lVar6 < 0x21) {
        if ((BLEND_ICEMAP < EVar4) && (0 < count)) {
          iVar11 = 0x20 - EVar4;
          pbVar10 = pin + 3;
          lVar6 = 0;
          do {
            bVar1 = *pbVar10;
            if (bVar1 != 0) {
              bVar2 = pbVar10[-1];
              iVar9 = ((uint)pbVar10[-2] * 0x8f + (uint)pbVar10[-3] * 0x4d +
                       ((uint)bVar2 + (uint)bVar2 * 8) * 4 >> 8) * (EVar4 + BLEND_MODULATE);
              iVar7 = (uint)pbVar10[-3] * iVar11 + iVar9;
              iVar16 = (uint)pbVar10[-2] * iVar11 + iVar9;
              iVar9 = (uint)bVar2 * iVar11 + iVar9;
              uVar13 = (uint)bVar1;
              uVar8 = uVar13 ^ 0xff;
              pout[lVar6 * 4 + 2] =
                   (BYTE)((ulong)(pout[lVar6 * 4 + 2] * uVar8 +
                                 ((uint)((ulong)((long)iVar7 * 0x84210843) >> 0x24) -
                                  (iVar7 >> 0x1f) & 0xff) * uVar13) * 0x1010102 >> 0x20);
              pout[lVar6 * 4 + 1] =
                   (BYTE)((ulong)(pout[lVar6 * 4 + 1] * uVar8 +
                                 ((uint)((ulong)((long)iVar16 * 0x84210843) >> 0x24) -
                                  (iVar16 >> 0x1f) & 0xff) * uVar13) * 0x1010102 >> 0x20);
              pout[lVar6 * 4] =
                   (BYTE)((ulong)(pout[lVar6 * 4] * uVar8 +
                                 ((uint)((ulong)((long)iVar9 * 0x84210843) >> 0x24) -
                                  (iVar9 >> 0x1f) & 0xff) * uVar13) * 0x1010102 >> 0x20);
              pout[lVar6 * 4 + 3] = bVar1;
            }
            lVar6 = lVar6 + 1;
            pbVar10 = pbVar10 + step;
          } while (count != (int)lVar6);
        }
      }
      else if (0 < count) {
        pbVar10 = pin + 3;
        lVar12 = 0;
        do {
          bVar1 = *pbVar10;
          if (bVar1 != 0) {
            uVar15 = (ulong)((uint)pbVar10[-2] * 0x8f + (uint)pbVar10[-3] * 0x4d +
                             ((uint)pbVar10[-1] + (uint)pbVar10[-1] * 8) * 4 >> 8);
            bVar2 = *(byte *)((long)pFVar5 + uVar15 * 4 + lVar6 * 0x518 + -0xa700);
            bVar3 = *(byte *)((long)pFVar5 + uVar15 * 4 + lVar6 * 0x518 + -0xa6ff);
            uVar13 = (uint)bVar1;
            uVar8 = uVar13 ^ 0xff;
            pout[lVar12 * 4 + 2] =
                 (BYTE)((ulong)(pout[lVar12 * 4 + 2] * uVar8 +
                               *(byte *)((long)pFVar5 + uVar15 * 4 + lVar6 * 0x518 + -0xa6fe) *
                               uVar13) * 0x1010102 >> 0x20);
            pout[lVar12 * 4 + 1] =
                 (BYTE)((ulong)(pout[lVar12 * 4 + 1] * uVar8 + bVar3 * uVar13) * 0x1010102 >> 0x20);
            pout[lVar12 * 4] =
                 (BYTE)((ulong)(pout[lVar12 * 4] * uVar8 + bVar2 * uVar13) * 0x1010102 >> 0x20);
            pout[lVar12 * 4 + 3] = bVar1;
          }
          lVar12 = lVar12 + 1;
          pbVar10 = pbVar10 + step;
        } while (count != (int)lVar12);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}